

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pvVar4;
  istream *piVar5;
  ostream *poVar6;
  int iVar7;
  string line;
  ifstream input_file;
  char local_269;
  char *local_268;
  long local_260;
  char local_258;
  undefined7 uStack_257;
  pointer local_248;
  pointer local_240;
  long local_238 [65];
  
  program_options::parse(argc,argv);
  pvVar4 = program_options::input_files();
  local_248 = (pvVar4->
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_240 = (pvVar4->
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_248 != local_240) {
    do {
      std::ifstream::ifstream((istream *)local_238,local_248->_M_str,_S_in);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"dog: could not open input file \'",0x20);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_248->_M_str,local_248->_M_len);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'!\n",3);
        std::ifstream::~ifstream(local_238);
        return 1;
      }
      local_268 = &local_258;
      local_260 = 0;
      local_258 = '\0';
      iVar7 = 1;
      while( true ) {
        cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                (char)(istream *)local_238);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_268,cVar2);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        bVar3 = program_options::show_line_numbers();
        lVar1 = std::cout;
        if (bVar3) {
          *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 6;
          lVar1 = *(long *)(lVar1 + -0x18);
          if (*(char *)(lVar1 + 0x1071b1) == '\0') {
            std::ios::widen((char)lVar1 + -0x30);
            *(undefined1 *)(lVar1 + 0x1071b1) = 1;
          }
          *(undefined1 *)(lVar1 + 0x1071b0) = 0x20;
          poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"  ",2);
          iVar7 = iVar7 + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,local_268,local_260);
        bVar3 = program_options::show_ends();
        if (bVar3) {
          local_269 = '$';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_269,1);
        }
        local_269 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_269,1);
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
      }
      std::ifstream::~ifstream((istream *)local_238);
      local_248 = local_248 + 1;
    } while (local_248 != local_240);
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[]) {
    try {
        program_options::parse(argc, argv);
    } catch (const std::exception &x) {
        std::cerr << x.what() << '\n';
        std::cerr << "usage: dog [-n|--number] [-E|--show-ends] <input_file> ...\n";
        return EXIT_FAILURE;
    }

    for (const auto &file_name : program_options::input_files()) {
        std::ifstream input_file(file_name.data(), std::ios::in);
        if (!input_file.is_open()) {
            std::cerr << "dog: could not open input file '" << file_name << "'!\n";
            return EXIT_FAILURE;
        }

        std::string line;
        int         line_count = 1;
        while (std::getline(input_file, line)) {
            if (program_options::show_line_numbers()) {
                std::cout << std::setw(6) << std::setfill(' ') << line_count++ << "  ";
            }

            std::cout << line;

            if (program_options::show_ends()) {
                std::cout << '$';
            }

            std::cout << '\n';
        }
    }

    return EXIT_SUCCESS;
}